

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>
::read_op(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
          *this,read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
                *other)

{
  size_t sVar1;
  
  (this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).completion_condition_.
  minimum_ = (other->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).
             completion_condition_.minimum_;
  this->stream_ = other->stream_;
  sVar1 = (other->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
          super_mutable_buffer.size_;
  (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
  super_mutable_buffer.data_ =
       (other->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
       super_mutable_buffer.data_;
  (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
  super_mutable_buffer.size_ = sVar1;
  (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_ =
       (other->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_;
  this->start_ = other->start_;
  fineftp::FtpSession::
  receiveDataFromSocketAndWriteToFile(std::shared_ptr<fineftp::FtpSession::IoFile>,std::shared_ptr<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>>)
  ::$_0::__0(&this->handler_,&other->handler_);
  return;
}

Assistant:

read_op(read_op&& other)
      : detail::base_from_completion_cond<CompletionCondition>(
          ASIO_MOVE_CAST(detail::base_from_completion_cond<
            CompletionCondition>)(other)),
        stream_(other.stream_),
        buffers_(ASIO_MOVE_CAST(buffers_type)(other.buffers_)),
        start_(other.start_),
        handler_(ASIO_MOVE_CAST(ReadHandler)(other.handler_))
    {
    }